

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

edata_t * duckdb_je_ecache_alloc
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *expand_edata
                    ,size_t size,size_t alignment,_Bool zero,_Bool guarded)

{
  edata_t *peVar1;
  _Bool commit;
  
  commit = true;
  peVar1 = extent_recycle(tsdn,pac,ehooks,ecache,expand_edata,size,alignment,zero,&commit,false,
                          guarded);
  return peVar1;
}

Assistant:

edata_t *
ecache_alloc(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool guarded) {
	assert(size != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	bool commit = true;
	edata_t *edata = extent_recycle(tsdn, pac, ehooks, ecache, expand_edata,
	    size, alignment, zero, &commit, false, guarded);
	assert(edata == NULL || edata_pai_get(edata) == EXTENT_PAI_PAC);
	assert(edata == NULL || edata_guarded_get(edata) == guarded);
	return edata;
}